

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O0

void __thiscall Teleport::SharedMemoryHandle::SharedMemoryHandle(SharedMemoryHandle *this)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  SharedMemory *pSVar5;
  char local_418 [4];
  int handle;
  char filename [1024];
  bool clearmemory;
  int attempt;
  SharedMemoryHandle *this_local;
  
  filename[0x3fc] = '\0';
  filename[0x3fd] = '\0';
  filename[0x3fe] = '\0';
  filename[0x3ff] = '\0';
  do {
    if (9 < (int)filename._1020_4_) {
      return;
    }
    filename[0x3fb] = '\x01';
    sprintf(local_418,"/UnityAudioTeleport%d",(ulong)(uint)filename._1020_4_);
    iVar1 = access(local_418,0);
    filename[0x3fb] = iVar1 == -1;
    iVar1 = shm_open(local_418,0x42,0x1ff);
    __stream = _stderr;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"Open failed: %s\n",pcVar4);
    }
    else {
      iVar2 = ftruncate(iVar1,0x2b1240);
      if (iVar2 == -1) {
        fprintf(_stderr,"ftruncate error (ignored)\n");
      }
      pSVar5 = (SharedMemory *)mmap((void *)0x0,0x2b1240,3,1,iVar1,0);
      this->data = pSVar5;
      if (this->data != (SharedMemory *)0xffffffffffffffff) {
        if ((filename[0x3fb] & 1U) == 0) {
          return;
        }
        memset(this->data,0,0x2b1240);
        return;
      }
      fprintf(_stderr,"mmap failed\n");
    }
    filename._1020_4_ = filename._1020_4_ + 1;
  } while( true );
}

Assistant:

SharedMemoryHandle()
        {
            for (int attempt = 0; attempt < 10; attempt++)
            {
                bool clearmemory = true;

#if UNITY_WIN

#if !UNITY_WINRT
                char filename[1024];
                sprintf_s(filename, "UnityAudioTeleport%d", attempt);
                hMapFile = CreateFileMapping(INVALID_HANDLE_VALUE, NULL, PAGE_READWRITE, 0, sizeof(SharedMemory), filename);
#else
                wchar_t filePath[MAX_PATH];
                GetTempPathW(MAX_PATH, filePath);

                wchar_t fileName[30];
                swprintf_s(fileName, L"UnityAudioTeleport%d", attempt);

                wcscat_s(filePath, fileName);                
                hMapFile = CreateFileMappingFromApp(INVALID_HANDLE_VALUE, NULL, PAGE_READWRITE, sizeof(SharedMemory), filePath);
#endif
                if (hMapFile == NULL)
                {
                    clearmemory = false;
#if !UNITY_WINRT
                    hMapFile = OpenFileMapping(FILE_MAP_ALL_ACCESS, FALSE, filename);
#else
                    hMapFile = OpenFileMappingFromApp(FILE_MAP_ALL_ACCESS, FALSE, filePath);
#endif
                }
                if (hMapFile == NULL)
                {
                    printf("Could not create file mapping object (%d).\n", GetLastError());
                    continue;
                }

                data = (SharedMemory*)MapViewOfFile(hMapFile, FILE_MAP_ALL_ACCESS, 0, 0, sizeof(SharedMemory));
                if (data == NULL)
                {
                    printf("Could not map view of file (%d).\n", GetLastError());
                    CloseHandle(hMapFile);
                    continue;
                }

#else
                char filename[1024];

#if UNITY_LINUX
                // a shared memory object should be identified by a name of the form /somename;
                // that is, a null-terminated string of up to NAME_MAX (i.e.,  255)  characters consisting of an initial slash,
                // followed by one or more characters, none of which are slashes.
                sprintf(filename, "/UnityAudioTeleport%d", attempt);
#else
                sprintf(filename, "/tmp/UnityAudioTeleport%d", attempt);
#endif
                clearmemory = (access(filename, F_OK) == -1);
                int handle = shm_open(filename, O_RDWR | O_CREAT, 0777);
                if (handle == -1)
                {
                    fprintf(stderr, "Open failed: %s\n", strerror(errno));
                    continue;
                }

                if (ftruncate(handle, sizeof(SharedMemory)) == -1)
                {
                    fprintf(stderr, "ftruncate error (ignored)\n");
                    //continue;
                }

                data = (SharedMemory*)mmap(0, sizeof(SharedMemory), PROT_READ | PROT_WRITE, MAP_SHARED, handle, 0);
                if (data == (void*)-1)
                {
                    fprintf(stderr, "mmap failed\n");
                    continue;
                }

                //close(handle);
                //shm_unlink(filename);

#endif

                if (clearmemory)
                    memset(data, 0, sizeof(SharedMemory));

                break; // intentional (see continue's above)
            }
        }